

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManPlaceDfs(Frc_Man_t *p,Vec_Int_t *vCoOrder)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Frc_Obj_t *pObj_00;
  bool bVar4;
  int local_28;
  int local_24;
  int nPlaces;
  int i;
  Frc_Obj_t *pObj;
  Vec_Int_t *vCoOrder_local;
  Frc_Man_t *p_local;
  
  local_28 = 0;
  local_24 = 0;
  pObj = (Frc_Obj_t *)vCoOrder;
  vCoOrder_local = (Vec_Int_t *)p;
  while( true ) {
    bVar4 = false;
    if (local_24 < *(int *)&vCoOrder_local[2].pArray) {
      _nPlaces = Frc_ManObj((Frc_Man_t *)vCoOrder_local,local_24);
      bVar4 = _nPlaces != (Frc_Obj_t *)0x0;
    }
    if (!bVar4) break;
    _nPlaces->iFanout = _nPlaces->nFanouts;
    if (_nPlaces->nFanouts == 0) {
      iVar3 = Frc_ObjIsCo(_nPlaces);
      if (iVar3 == 0) {
        _nPlaces->pPlace = local_28;
        local_28 = local_28 + 1;
      }
    }
    iVar3 = Frc_ObjSize(_nPlaces);
    local_24 = iVar3 + local_24;
  }
  local_24 = 0;
  while( true ) {
    iVar3 = local_24;
    iVar2 = Vec_IntSize((Vec_Int_t *)pObj);
    pVVar1 = vCoOrder_local;
    bVar4 = false;
    if (iVar3 < iVar2) {
      iVar3 = Vec_IntEntry((Vec_Int_t *)pObj,local_24);
      _nPlaces = Frc_ManObj((Frc_Man_t *)pVVar1,iVar3);
      bVar4 = _nPlaces != (Frc_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar3 = Frc_ObjIsCo(_nPlaces);
    pVVar1 = vCoOrder_local;
    if (iVar3 == 0) {
      __assert_fail("Frc_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                    ,0x343,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
    }
    pObj_00 = Frc_ObjFanin(_nPlaces,0);
    Frc_ManPlaceDfs_rec((Frc_Man_t *)pVVar1,pObj_00,&local_28);
    _nPlaces->pPlace = local_28;
    local_24 = local_24 + 1;
    local_28 = local_28 + 1;
  }
  if (local_28 == *(int *)&vCoOrder_local[1].pArray) {
    return;
  }
  __assert_fail("nPlaces == p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                ,0x347,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
}

Assistant:

void Frc_ManPlaceDfs( Frc_Man_t * p, Vec_Int_t * vCoOrder )
{
    Frc_Obj_t * pObj;
    int i, nPlaces = 0;
    Frc_ManForEachObj( p, pObj, i )
    {
        pObj->iFanout = pObj->nFanouts;
        if ( pObj->nFanouts == 0 && !Frc_ObjIsCo(pObj) )
            pObj->pPlace = nPlaces++;
    }
    Frc_ManForEachObjVec( vCoOrder, p, pObj, i )
    {
        assert( Frc_ObjIsCo(pObj) );
        Frc_ManPlaceDfs_rec( p, Frc_ObjFanin(pObj,0), &nPlaces );
        pObj->pPlace = nPlaces++;
    }
    assert( nPlaces == p->nObjs );
}